

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequencer.h
# Opt level: O2

void __thiscall
disruptor::Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::BusySpinStrategy,_0>::
Sequencer(Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::BusySpinStrategy,_0> *this,
         size_t n)

{
  RingBuffer<long,_0>::RingBuffer(&this->ring_buffer_,n);
  (this->cursor_).sequence_.super___atomic_base<long>._M_i = -1;
  MultiThreadedStrategyEx::MultiThreadedStrategyEx(&this->claim_strategy_,n);
  (this->wait_strategy_)._vptr_BusySpinStrategy = (_func_int **)&PTR_SignalAllWhenBlocking_00135878;
  (this->gating_sequences_).
  super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->gating_sequences_).
  super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->gating_sequences_).
  super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

Sequencer(size_t n) : ring_buffer_(n), claim_strategy_(n) {}